

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_binning_array_unaligned.h
# Opt level: O3

LinearSpace3fa * __thiscall
embree::sse2::UnalignedHeuristicArrayBinningMB<embree::PrimRefMB,_32UL>::computeAlignedSpaceMB
          (LinearSpace3fa *__return_storage_ptr__,
          UnalignedHeuristicArrayBinningMB<embree::PrimRefMB,_32UL> *this,Scene *scene,SetMB *set)

{
  uint uVar1;
  uint uVar2;
  PrimRefMB *pPVar3;
  Geometry *pGVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [12];
  long lVar10;
  ulong uVar11;
  unsigned_long uVar12;
  ulong uVar13;
  ulong uVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  float fVar26;
  float fVar27;
  undefined1 auVar24 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar25;
  float fVar28;
  vfloat4 a;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar31;
  float fVar32;
  Vec3fa axis1;
  undefined8 local_78;
  undefined8 uStack_70;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  uVar13 = (set->super_PrimInfoMB).object_range._begin;
  uVar12 = (set->super_PrimInfoMB).object_range._end;
  if (uVar13 < uVar12) {
    lVar10 = uVar13 * 0x50 + 0x1c;
    local_78 = 0;
    uStack_70 = 0x3f800000;
    uVar11 = 0xffffffffffffffff;
    do {
      pPVar3 = set->prims->items;
      uVar1 = *(uint *)((long)pPVar3 + lVar10 + -0x10);
      uVar2 = *(uint *)((long)&(pPVar3->lbounds).bounds0.lower.field_0 + lVar10);
      uVar14 = CONCAT44(uVar2,uVar1);
      if (uVar14 < uVar11) {
        pGVar4 = (scene->geometries).items[uVar1].ptr;
        fVar18 = (pGVar4->time_range).lower;
        fVar20 = pGVar4->fnumTimeSegments;
        fVar16 = (set->super_PrimInfoMB).time_range.upper;
        fVar19 = (pGVar4->time_range).upper - fVar18;
        fVar15 = floorf((((set->super_PrimInfoMB).time_range.lower - fVar18) / fVar19) * 1.0000002 *
                        fVar20);
        fVar17 = 0.0;
        if (0.0 <= fVar15) {
          fVar17 = fVar15;
        }
        fVar16 = ceilf(((fVar16 - fVar18) / fVar19) * 0.99999976 * fVar20);
        if (fVar20 <= fVar16) {
          fVar16 = fVar20;
        }
        if ((int)fVar16 != (int)fVar17) {
          (*(pGVar4->super_RefCount)._vptr_RefCount[0x38])
                    (&local_48,pGVar4,(ulong)uVar2,(long)(((int)fVar16 + (int)fVar17) / 2));
          fVar18 = fStack_44 * fStack_44;
          fVar17 = fStack_40 * fStack_40;
          fVar15 = fStack_3c * fStack_3c;
          fVar20 = fVar18 + local_48 * local_48 + fVar17;
          fVar16 = fVar18 + fVar18 + fVar15;
          fVar17 = fVar18 + fVar17 + fVar17;
          fVar15 = fVar18 + fVar15 + fVar15;
          if (1e-18 < fVar20) {
            auVar21._4_4_ = fVar16;
            auVar21._0_4_ = fVar20;
            auVar21._8_4_ = fVar17;
            auVar21._12_4_ = fVar15;
            auVar30._4_4_ = fVar16;
            auVar30._0_4_ = fVar20;
            auVar30._8_4_ = fVar17;
            auVar30._12_4_ = fVar15;
            auVar30 = rsqrtss(auVar21,auVar30);
            fVar16 = auVar30._0_4_;
            fVar20 = fVar16 * fVar16 * fVar20 * -0.5 * fVar16 + fVar16 * 1.5;
            local_78 = CONCAT44(fStack_44 * fVar20,local_48 * fVar20);
            uStack_70 = CONCAT44(fStack_3c * fVar20,fStack_40 * fVar20);
            uVar11 = uVar14;
          }
          uVar12 = (set->super_PrimInfoMB).object_range._end;
        }
      }
      uVar13 = uVar13 + 1;
      lVar10 = lVar10 + 0x50;
    } while (uVar13 < uVar12);
  }
  else {
    local_78 = 0;
    uStack_70 = 0x3f800000;
  }
  fVar20 = -local_78._4_4_;
  fVar16 = -(float)uStack_70;
  auVar22._8_4_ = 0xffffffff;
  auVar22._0_8_ = 0xffffffffffffffff;
  if (fVar20 * fVar20 + (float)uStack_70 * (float)uStack_70 + 0.0 <=
      (float)local_78 * (float)local_78 + fVar16 * fVar16 + 0.0) {
    auVar22 = SUB1612((undefined1  [16])0x0,0);
  }
  auVar23._0_4_ = ~auVar22._0_4_ & (uint)fVar16;
  auVar23._4_4_ = 0;
  auVar23._8_4_ = ~auVar22._8_4_ & (uint)(float)local_78;
  auVar9._4_4_ = (uint)fVar20 & auVar22._8_4_;
  auVar9._0_4_ = (uint)(float)uStack_70 & auVar22._4_4_;
  auVar9._8_4_ = 0;
  auVar23 = auVar23 | auVar9 << 0x20;
  fVar16 = auVar23._0_4_;
  fVar17 = auVar23._4_4_;
  fVar18 = auVar23._8_4_;
  fVar20 = fVar17 * fVar17;
  fVar15 = fVar18 * fVar18;
  fVar19 = fVar20 + fVar16 * fVar16 + fVar15;
  fVar28 = fVar20 + fVar20 + 0.0;
  fVar15 = fVar20 + fVar15 + fVar15;
  fVar20 = fVar20 + 0.0 + 0.0;
  auVar29._4_4_ = fVar28;
  auVar29._0_4_ = fVar19;
  auVar29._8_4_ = fVar15;
  auVar29._12_4_ = fVar20;
  auVar7._4_4_ = fVar28;
  auVar7._0_4_ = fVar19;
  auVar7._8_4_ = fVar15;
  auVar7._12_4_ = fVar20;
  auVar30 = rsqrtss(auVar29,auVar7);
  fVar20 = auVar30._0_4_;
  fVar20 = fVar20 * 1.5 - fVar20 * fVar20 * fVar19 * 0.5 * fVar20;
  fVar16 = fVar20 * fVar16;
  fVar17 = fVar20 * fVar17;
  fVar18 = fVar20 * fVar18;
  fVar15 = fVar17 * (float)local_78 - local_78._4_4_ * fVar16;
  fVar19 = fVar18 * local_78._4_4_ - (float)uStack_70 * fVar17;
  fVar28 = fVar16 * (float)uStack_70 - (float)local_78 * fVar18;
  fVar27 = fVar20 * 0.0 * uStack_70._4_4_ - uStack_70._4_4_ * fVar20 * 0.0;
  fVar20 = fVar19 * fVar19;
  fVar26 = fVar28 * fVar28;
  fVar27 = fVar27 * fVar27;
  fVar31 = fVar26 + fVar20 + fVar15 * fVar15;
  fVar32 = fVar27 + fVar20 + fVar20;
  fVar26 = fVar26 + fVar20 + fVar26;
  fVar27 = fVar27 + fVar20 + fVar27;
  auVar24._4_4_ = fVar32;
  auVar24._0_4_ = fVar31;
  auVar24._8_4_ = fVar26;
  auVar24._12_4_ = fVar27;
  auVar8._4_4_ = fVar32;
  auVar8._0_4_ = fVar31;
  auVar8._8_4_ = fVar26;
  auVar8._12_4_ = fVar27;
  auVar30 = rsqrtss(auVar24,auVar8);
  fVar20 = auVar30._0_4_;
  fVar20 = fVar20 * 1.5 - fVar20 * fVar20 * fVar31 * 0.5 * fVar20;
  aVar25.m128[1] = fVar20 * fVar28;
  aVar25.m128[0] = fVar17;
  aVar25.m128[2] = local_78._4_4_;
  aVar25.m128[3] = 0.0;
  aVar5.m128[1] = fVar20 * fVar19;
  aVar5.m128[0] = fVar16;
  aVar5.m128[2] = (float)local_78;
  aVar5.m128[3] = 0.0;
  (__return_storage_ptr__->vx).field_0 = aVar5;
  (__return_storage_ptr__->vy).field_0 = aVar25;
  aVar6.m128[1] = fVar20 * fVar15;
  aVar6.m128[0] = fVar18;
  aVar6.m128[2] = (float)uStack_70;
  aVar6.m128[3] = 0.0;
  (__return_storage_ptr__->vz).field_0 = aVar6;
  return __return_storage_ptr__;
}

Assistant:

const LinearSpace3fa computeAlignedSpaceMB(Scene* scene, const SetMB& set)
        {
          Vec3fa axis0(0,0,1);
          uint64_t bestGeomPrimID = -1;

          /*! find curve with minimum ID that defines valid direction */
          for (size_t i=set.begin(); i<set.end(); i++)
          {
            const PrimRefMB& prim = (*set.prims)[i];
            const unsigned int geomID = prim.geomID();
            const unsigned int primID = prim.primID();
            const uint64_t geomprimID = prim.ID64();
            if (geomprimID >= bestGeomPrimID) continue;
            
            const Geometry* mesh = scene->get(geomID);
            const range<int> tbounds = mesh->timeSegmentRange(set.time_range);
            if (tbounds.size() == 0) continue;

            const size_t t = (tbounds.begin()+tbounds.end())/2;
            const Vec3fa axis1 = mesh->computeDirection(primID,t);
            if (sqr_length(axis1) > 1E-18f) {
              axis0 = normalize(axis1);
              bestGeomPrimID = geomprimID;
            }
          }

          return frame(axis0).transposed();
        }